

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

ssize_t httplib::detail::write_headers<httplib::Request>
                  (Stream *strm,Request *info,Headers *headers)

{
  int iVar1;
  ssize_t sVar2;
  _Base_ptr p_Var3;
  int extraout_var;
  uint uVar4;
  long lVar5;
  long lVar6;
  ssize_t unaff_RBP;
  _Rb_tree_header *p_Var7;
  bool bVar8;
  char *local_48;
  char *local_40;
  Headers *local_38;
  
  p_Var3 = (info->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(info->headers)._M_t._M_impl.super__Rb_tree_header;
  bVar8 = (_Rb_tree_header *)p_Var3 == p_Var7;
  local_38 = headers;
  if (bVar8) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)(p_Var3 + 1));
      if (iVar1 == 0) {
        uVar4 = 3;
      }
      else {
        local_40 = *(char **)(p_Var3 + 1);
        local_48 = *(char **)(p_Var3 + 2);
        sVar2 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_40,&local_48)
        ;
        uVar4 = (uint)((ulong)sVar2 >> 0x3f);
        lVar5 = 0;
        if (0 < sVar2) {
          lVar5 = sVar2;
        }
        if (sVar2 < 0) {
          unaff_RBP = sVar2;
        }
        lVar6 = lVar6 + lVar5;
      }
      if ((uVar4 != 3) && (uVar4 != 0)) break;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar8 = (_Rb_tree_header *)p_Var3 == p_Var7;
    } while (!bVar8);
  }
  sVar2 = unaff_RBP;
  if (bVar8) {
    p_Var3 = (local_38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(local_38->_M_t)._M_impl.super__Rb_tree_header;
    bVar8 = (_Rb_tree_header *)p_Var3 == p_Var7;
    if (!bVar8) {
      local_40 = *(char **)(p_Var3 + 1);
      local_48 = *(char **)(p_Var3 + 2);
      sVar2 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_40,&local_48);
      lVar5 = 0;
      if (-1 < sVar2) {
        lVar5 = sVar2;
      }
      lVar6 = lVar5 + lVar6;
      if (-1 < sVar2) {
        do {
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          bVar8 = (_Rb_tree_header *)p_Var3 == p_Var7;
          sVar2 = unaff_RBP;
          if (bVar8) break;
          local_40 = *(char **)(p_Var3 + 1);
          local_48 = *(char **)(p_Var3 + 2);
          sVar2 = Stream::write_format<char_const*,char_const*>
                            (strm,"%s: %s\r\n",&local_40,&local_48);
          lVar5 = 0;
          if (-1 < sVar2) {
            lVar5 = sVar2;
          }
          lVar6 = lVar6 + lVar5;
        } while (-1 < sVar2);
      }
    }
    if (bVar8) {
      iVar1 = (*strm->_vptr_Stream[5])(strm,"\r\n",2);
      if (extraout_var < 0) {
        lVar6 = 0;
      }
      sVar2 = lVar6 + CONCAT44(extraout_var,iVar1);
    }
  }
  return sVar2;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const T &info,
									 const Headers &headers) {
			ssize_t write_len = 0;
			for (const auto &x : info.headers) {
				if (x.first == "EXCEPTION_WHAT") { continue; }
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			for (const auto &x : headers) {
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			auto len = strm.write("\r\n");
			if (len < 0) { return len; }
			write_len += len;
			return write_len;
		}